

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

int Dam_ManUpdateNode(Dam_Man_t *p,int iObj,int iLit0,int iLit1,int iLitNew,Vec_Int_t *vDivs)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  float *pfVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  uint uVar20;
  Hash_IntMan_t *p_00;
  uint uVar21;
  long lVar22;
  uint uVar23;
  uint *puVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  uVar17 = 0;
  if (iObj < p->vNod2Set->nSize) {
    if (iObj < 0) {
LAB_006fdc24:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar17 = (ulong)(uint)p->vNod2Set->pArray[(uint)iObj];
  }
  iVar12 = 0;
  iVar11 = (int)uVar17;
  if (iVar11 == 0) {
    puVar24 = (uint *)0x0;
  }
  else {
    if ((iVar11 < 0) || (p->vSetStore->nSize <= iVar11)) {
LAB_006fdb6a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    puVar24 = (uint *)(p->vSetStore->pArray + uVar17);
  }
  uVar20 = *puVar24;
  uVar17 = (ulong)uVar20;
  bVar25 = (int)uVar20 < 1;
  if (0 < (int)uVar20) {
    if (puVar24[1] != iLit0) {
      uVar14 = 0;
      do {
        if (uVar17 - 1 == uVar14) {
          return 0;
        }
        uVar1 = uVar14 + 1;
        lVar22 = uVar14 + 2;
        uVar14 = uVar1;
      } while (puVar24[lVar22] != iLit0);
      bVar25 = uVar17 <= uVar1;
    }
    iVar12 = 0;
    if (!bVar25) {
      if (puVar24[1] != iLit1) {
        uVar14 = 0;
        do {
          if ((ulong)(uVar20 + 1) - 2 == uVar14) {
            return 0;
          }
          uVar1 = uVar14 + 1;
          lVar22 = uVar14 + 2;
          uVar14 = uVar1;
        } while (puVar24[lVar22] != iLit1);
        if (uVar17 <= uVar1) {
          return 0;
        }
      }
      Vec_IntPush(vDivs,-iObj);
      uVar20 = 1;
      if (0 < (int)*puVar24) {
        lVar22 = 1;
LAB_006fd6c7:
        uVar8 = puVar24[lVar22];
        if (uVar8 != iLit1 && uVar8 != iLit0) {
          lVar9 = (long)(int)uVar20;
          uVar20 = uVar20 + 1;
          puVar24[lVar9] = uVar8;
          uVar16 = 0;
          uVar13 = 0;
LAB_006fd708:
          uVar23 = iLit1;
          if (uVar13 == 0) {
            uVar23 = iLit0;
          }
          if (iLit1 < iLit0 == (int)uVar23 < (int)uVar8) {
            pVVar2 = p->vHash->vTable;
            uVar15 = pVVar2->nSize;
            uVar17 = (ulong)(uVar23 * 0x1ec1 + uVar8 * 0x1051) % (ulong)uVar15;
            iVar12 = (int)uVar17;
            if ((-1 < iVar12) && (iVar12 < (int)uVar15)) {
              puVar10 = (uint *)(pVVar2->pArray + uVar17);
              while( true ) {
                uVar15 = *puVar10;
                if (uVar15 == 0) {
                  puVar19 = (uint *)0x0;
                }
                else {
                  if ((int)uVar15 < 0) goto LAB_006fdb6a;
                  pVVar2 = p->vHash->vObjs;
                  if (pVVar2->nSize <= (int)(uVar15 * 4)) goto LAB_006fdb6a;
                  puVar19 = (uint *)(pVVar2->pArray + uVar15 * 4);
                }
                if (puVar19 == (uint *)0x0) goto LAB_006fd81e;
                if ((*puVar19 == uVar8) && (puVar19[1] == uVar23)) break;
                puVar10 = puVar19 + 3;
              }
              goto LAB_006fd826;
            }
            goto LAB_006fdb6a;
          }
          pVVar2 = p->vHash->vTable;
          uVar15 = pVVar2->nSize;
          uVar17 = (ulong)(uVar23 * 0x1051 + uVar8 * 0x1ec1) % (ulong)uVar15;
          iVar12 = (int)uVar17;
          if ((iVar12 < 0) || ((int)uVar15 <= iVar12)) goto LAB_006fdb6a;
          puVar10 = (uint *)(pVVar2->pArray + uVar17);
          while( true ) {
            uVar15 = *puVar10;
            if (uVar15 == 0) {
              puVar19 = (uint *)0x0;
            }
            else {
              if ((int)uVar15 < 0) goto LAB_006fdb6a;
              pVVar2 = p->vHash->vObjs;
              if (pVVar2->nSize <= (int)(uVar15 * 4)) goto LAB_006fdb6a;
              puVar19 = (uint *)(pVVar2->pArray + uVar15 * 4);
            }
            if (puVar19 == (uint *)0x0) goto LAB_006fd81e;
            if ((*puVar19 == uVar23) && (puVar19[1] == uVar8)) break;
            puVar10 = puVar19 + 3;
          }
          goto LAB_006fd826;
        }
        goto LAB_006fdb03;
      }
LAB_006fdb17:
      puVar24[(int)uVar20] = iLitNew;
      *puVar24 = uVar20;
      iVar12 = 1;
    }
  }
  return iVar12;
LAB_006fd81e:
  if (uVar15 != 0) {
    __assert_fail("*pPlace == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHash.h"
                  ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
  }
LAB_006fd826:
  uVar23 = *puVar10;
  lVar9 = (long)(int)uVar23;
  if (0 < lVar9) {
    if (p->vCounts->nSize <= (int)uVar23) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
    }
    pfVar3 = p->vCounts->pArray;
    pfVar3[lVar9] = pfVar3[lVar9] + -1.0;
    pVVar4 = p->vQue;
    if (((int)uVar23 < pVVar4->nCap) && (-1 < pVVar4->pOrder[lVar9])) {
      pfVar3 = *pVVar4->pCostsFlt;
      if (pfVar3 == (float *)0x0) {
        fVar26 = (float)(int)uVar23;
      }
      else {
        fVar26 = pfVar3[lVar9];
      }
      piVar5 = pVVar4->pOrder;
      uVar15 = piVar5[lVar9];
      uVar17 = (ulong)(int)uVar15;
      if (uVar17 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      piVar6 = pVVar4->pHeap;
      if (piVar6[uVar17] != uVar23) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      bVar25 = true;
      if (1 < (int)uVar15) {
        uVar14 = uVar17;
        uVar17 = (ulong)uVar15;
        bVar7 = false;
        do {
          bVar25 = bVar7;
          uVar17 = uVar17 >> 1;
          iVar12 = piVar6[uVar17];
          if (pfVar3 == (float *)0x0) {
            fVar27 = (float)iVar12;
          }
          else {
            fVar27 = pfVar3[iVar12];
          }
          uVar15 = (uint)uVar14;
          if (fVar26 <= fVar27) {
            uVar17 = uVar14 & 0xffffffff;
            break;
          }
          piVar6[uVar14 & 0xffffffff] = iVar12;
          piVar5[iVar12] = uVar15;
          bVar25 = true;
          uVar14 = uVar17;
          bVar7 = true;
        } while (3 < uVar15);
        bVar25 = !bVar25;
      }
      iVar12 = (int)uVar17;
      piVar6[iVar12] = uVar23;
      piVar5[lVar9] = iVar12;
      if (bVar25) {
        if (pfVar3 == (float *)0x0) {
          fVar26 = (float)(int)uVar23;
        }
        else {
          fVar26 = pfVar3[lVar9];
        }
        uVar15 = iVar12 * 2;
        iVar11 = pVVar4->nSize;
        if ((int)uVar15 < iVar11) {
          do {
            iVar12 = (int)uVar17;
            uVar21 = uVar15 | 1;
            if ((int)uVar21 < iVar11) {
              if (pfVar3 == (float *)0x0) {
                fVar27 = (float)piVar6[(int)uVar15];
              }
              else {
                fVar27 = pfVar3[piVar6[(int)uVar15]];
              }
              if (pfVar3 == (float *)0x0) {
                fVar28 = (float)piVar6[(int)uVar21];
              }
              else {
                fVar28 = pfVar3[piVar6[(int)uVar21]];
              }
              uVar17 = (ulong)uVar15;
              if (fVar27 < fVar28) {
                uVar17 = (ulong)uVar21;
              }
            }
            else {
              uVar17 = (ulong)uVar15;
            }
            iVar18 = (int)uVar17;
            if (iVar11 <= iVar18) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar11 = piVar6[iVar18];
            if (pfVar3 == (float *)0x0) {
              fVar27 = (float)iVar11;
            }
            else {
              fVar27 = pfVar3[iVar11];
            }
            if (fVar27 <= fVar26) break;
            piVar6[iVar12] = iVar11;
            piVar5[iVar11] = iVar12;
            uVar15 = iVar18 * 2;
            iVar11 = pVVar4->nSize;
            iVar12 = iVar18;
          } while ((int)uVar15 < iVar11);
        }
        piVar6[iVar12] = uVar23;
        piVar5[lVar9] = iVar12;
      }
      uVar16 = uVar16 | 1 << (uVar13 & 0x1f);
    }
  }
  bVar25 = uVar13 != 0;
  uVar13 = uVar13 + 1;
  if (bVar25) goto code_r0x006fda12;
  goto LAB_006fd708;
code_r0x006fda12:
  if (uVar16 == 3) {
    if (iLit1 < iLit0 == iLitNew < (int)uVar8) {
      p_00 = p->vHash;
      uVar13 = iLitNew;
      uVar16 = uVar8;
    }
    else {
      p_00 = p->vHash;
      uVar13 = uVar8;
      uVar16 = iLitNew;
    }
    uVar8 = Hash_Int2ManInsert(p_00,uVar16,uVar13,uVar8);
    if ((int)uVar8 < 0) goto LAB_006fdb6a;
    pVVar2 = p->vHash->vObjs;
    uVar13 = uVar8 * 4;
    uVar16 = pVVar2->nSize;
    if (uVar16 == uVar13 || SBORROW4(uVar16,uVar13) != (int)(uVar16 + uVar8 * -4) < 0)
    goto LAB_006fdb6a;
    piVar5 = pVVar2->pArray + (ulong)uVar13 + 2;
    *piVar5 = *piVar5 + 1;
    Vec_IntPush(vDivs,uVar8);
    iVar12 = p->vDivLevR->nSize;
    if (iVar12 <= (int)uVar8) {
      Vec_IntFillExtra(p->vDivLevR,(iVar12 * 3) / 2,0);
    }
    if (((iObj < 0) || (p->vNodLevR->nSize <= iObj)) || (p->vDivLevR->nSize <= (int)uVar8))
    goto LAB_006fdc24;
    iVar12 = p->vNodLevR->pArray[(uint)iObj];
    piVar5 = p->vDivLevR->pArray;
    if (piVar5[uVar8] < iVar12) {
      piVar5[uVar8] = iVar12;
    }
  }
LAB_006fdb03:
  bVar25 = (int)*puVar24 <= lVar22;
  lVar22 = lVar22 + 1;
  if (bVar25) goto LAB_006fdb17;
  goto LAB_006fd6c7;
}

Assistant:

int Dam_ManUpdateNode( Dam_Man_t * p, int iObj, int iLit0, int iLit1, int iLitNew, Vec_Int_t * vDivs )
{
    int * pSet = Dam_ObjSet( p, iObj );
    int i, k, c, Num, iLit, iLit2, fPres;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit0 )
            break;
    if ( i > pSet[0] )
        return 0;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit1 )
            break;
    if ( i > pSet[0] )
        return 0;
    // compact literals
    Vec_IntPush( vDivs, -iObj );
    for ( k = i = 1; i <= pSet[0]; i++ )
    {
        if ( iLit0 == pSet[i] || iLit1 == pSet[i] )
            continue;
        pSet[k++] = iLit = pSet[i];
        // reduce weights of the divisors
        fPres = 0;
        for ( c = 0; c < 2; c++ )
        {
            iLit2 = c ? iLit1 : iLit0;
            if ( (iLit > iLit2) ^ (iLit0 > iLit1) )
                Num = *Hash_Int2ManLookup( p->vHash, iLit2, iLit );
            else
                Num = *Hash_Int2ManLookup( p->vHash, iLit, iLit2 );
            if ( Num > 0 )
            {
                Vec_FltAddToEntry( p->vCounts, Num, -1 );
                if ( Vec_QueIsMember(p->vQue, Num) )
                {
                    Vec_QueUpdate( p->vQue, Num );
                    fPres |= (1 << c);
                }
            }
        }
        if ( fPres != 3 )
            continue;
        if ( (iLit > iLitNew) ^ (iLit0 > iLit1) )
            Num = Hash_Int2ManInsert( p->vHash, iLitNew, iLit, 0 );
        else
            Num = Hash_Int2ManInsert( p->vHash, iLit, iLitNew, 0 );
        Hash_Int2ObjInc( p->vHash, Num );
        Vec_IntPush( vDivs, Num );
        // update reverse level
        if ( Num >= Vec_IntSize(p->vDivLevR) )
            Vec_IntFillExtra( p->vDivLevR, 3 * Vec_IntSize(p->vDivLevR) / 2, 0 );
        Vec_IntUpdateEntry( p->vDivLevR, Num, Vec_IntEntry(p->vNodLevR, iObj) );
    }
    pSet[k] = iLitNew;
    pSet[0] = k;
    return 1;
}